

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

void __thiscall BpTree<float>::Block2Node(BpTree<float> *this,int BlockNum,IndexNode<float> *Node)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  char buf [100];
  stringstream temp_1;
  stringstream temp;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [128];
  ios_base aiStack_138 [264];
  
  pcVar3 = blocks.buffer[BlockNum].data + 1;
  Node->NodeState = blocks.buffer[BlockNum].data[0];
  if (1 < this->N) {
    lVar2 = 0;
    do {
      std::__cxx11::stringstream::stringstream(local_1b8);
      (Node->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar2] = *pcVar3;
      if ((Node->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar2] == '1') {
        if (this->Data_Type == '2') {
          std::__cxx11::stringstream::stringstream(local_340);
          local_3a8 = *(undefined8 *)(pcVar3 + 1);
          uStack_3a0 = *(undefined8 *)(pcVar3 + 9);
          local_398 = *(undefined8 *)(pcVar3 + 0x11);
          uStack_390 = *(undefined8 *)(pcVar3 + 0x19);
          sVar1 = strlen((char *)&local_3a8);
          std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)&local_3a8,sVar1);
          std::istream::_M_extract<float>((float *)local_340);
          std::__cxx11::stringstream::~stringstream(local_340);
          std::ios_base::~ios_base(local_2c0);
        }
        else {
          (Node->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar2] = *(float *)(pcVar3 + 1);
        }
      }
      pcVar3 = pcVar3 + 5;
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(aiStack_138);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (long)this->N + -1);
  }
  if ((Node->NodeState == '1') && (1 < this->N)) {
    lVar2 = 0;
    do {
      (Node->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar2].BlockNum = *(int *)pcVar3;
      pcVar3 = pcVar3 + 4;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (long)this->N + -1);
  }
  if (0 < this->N) {
    lVar2 = 0;
    do {
      (Node->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar2].FileOff = *(int *)pcVar3;
      pcVar3 = pcVar3 + 4;
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->N);
  }
  (Node->parent).FileOff = *(int *)pcVar3;
  return;
}

Assistant:

void BpTree<K>::Block2Node(int BlockNum, IndexNode<K>& Node) {
	int i;
	char buf[100];
	char* p = blocks.buffer[BlockNum].data;
	memcpy(&Node.NodeState, p, sizeof(char));
	p += sizeof(char);
	for (i = 0; i < N - 1; i++) {
		stringstream temp;
		memcpy(&Node.v[i], p, sizeof(char));
		p += sizeof(char);
		if (Node.v[i] == '1') {
			if (this->Data_Type == STRING) {
				stringstream temp;
				memcpy(buf, p, sizeof(string));
				temp << buf;
				temp >> Node.k[i];
			}
			else {
				memcpy(reinterpret_cast<char*>(&Node.k[i]), p, sizeof(K));
			}
		}
		p += sizeof(K);
	}
	if (Node.NodeState == LEAF) {
		for (i = 0; i < N - 1; i++) {
			memcpy(reinterpret_cast<char*>(&Node.p[i].BlockNum), p, sizeof(int));
			p += sizeof(int);
		}
	}
	for (i = 0; i < N; i++) {
		memcpy(reinterpret_cast<char*>(&Node.p[i].FileOff), p, sizeof(int));
		p += sizeof(int);
	}
	memcpy(reinterpret_cast<char*>(&Node.parent.FileOff), p, sizeof(int));
}